

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_validate_file(mz_zip_archive *pZip,mz_uint file_index,mz_uint flags)

{
  long lVar1;
  byte bVar2;
  mz_zip_internal_state *pmVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  uint uVar7;
  void *__s2;
  mz_bool mVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  mz_zip_error mVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  size_t sVar16;
  mz_uint8 *pCentral_dir_header;
  byte *pbVar17;
  uint uVar18;
  uint uVar19;
  mz_uint64 mVar20;
  byte *pbVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  bool bVar28;
  short *local_540;
  uint local_528;
  ulong local_518;
  ulong local_510;
  mz_uint8 descriptor_buf [32];
  mz_uint32 uncomp_crc32;
  mz_bool found_zip64_ext_data_in_cdir;
  ulong local_4e0;
  mz_zip_array local_4d8;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  
  found_zip64_ext_data_in_cdir = 0;
  uncomp_crc32 = 0;
  local_4d8.m_capacity = 0;
  local_4d8.m_p = (short *)0x0;
  local_4d8.m_size = 0;
  local_4d8.m_element_size = 1;
  local_4d8._28_4_ = 0;
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar3 = pZip->m_pState;
  if ((((pmVar3 == (mz_zip_internal_state *)0x0) || (pZip->m_pAlloc == (mz_alloc_func)0x0)) ||
      (pZip->m_pFree == (mz_free_func)0x0)) || (pZip->m_pRead == (mz_file_read_func)0x0)) {
LAB_00109c7b:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (pZip->m_total_files < file_index) goto LAB_00109c7b;
  if (file_index < pZip->m_total_files) {
    pCentral_dir_header =
         (mz_uint8 *)
         ((ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
         (long)(pmVar3->m_central_dir).m_p);
  }
  else {
    pCentral_dir_header = (mz_uint8 *)0x0;
  }
  mVar8 = mz_zip_file_stat_internal
                    (pZip,file_index,pCentral_dir_header,&file_stat,&found_zip64_ext_data_in_cdir);
  if (mVar8 == 0) {
    return 0;
  }
  if (file_stat.m_is_directory != 0) {
    return 1;
  }
  if (file_stat.m_uncomp_size == 0) {
    return 1;
  }
  if (file_stat.m_is_encrypted != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if ((file_stat.m_method & 0xfff7) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  if (file_stat.m_is_supported == 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
    return 0;
  }
  sVar13 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat.m_local_header_ofs,local_header_u32,0x1e);
  if (sVar13 != 0x1e) {
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_header_u32[0] != 0x4034b50) {
LAB_00109dec:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar23 = (ulong)local_header_u32[6]._2_2_;
  local_528 = (uint)(ushort)local_header_u32[7];
  local_518 = (ulong)(uint)local_header_u32._18_4_;
  local_510 = (ulong)(uint)local_header_u32._22_4_;
  sVar14 = strlen(file_stat.m_filename);
  if (sVar14 != uVar23) goto LAB_00109dec;
  mVar20 = file_stat.m_local_header_ofs + uVar23 + 0x1e;
  local_4e0 = (ulong)local_528;
  lVar1 = mVar20 + local_4e0;
  if (pZip->m_archive_size < file_stat.m_comp_size + lVar1) goto LAB_00109dec;
  uVar15 = (ulong)local_528;
  if (local_528 < local_header_u32[6]._2_2_) {
    uVar15 = uVar23;
  }
  if (((int)uVar15 != 0) &&
     (mVar8 = mz_zip_array_ensure_capacity(pZip,&local_4d8,uVar15,0), mVar8 == 0)) {
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    goto LAB_0010a309;
  }
  __s2 = local_4d8.m_p;
  if (uVar23 == 0) {
LAB_00109ea9:
    if ((local_528 != 0) && ((local_header_u32._18_4_ == -1 || (local_header_u32._22_4_ == -1)))) {
      local_540 = (short *)local_4d8.m_p;
      sVar13 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar20,local_4d8.m_p,local_4e0);
      if (sVar13 != local_4e0) goto LAB_0010a215;
      do {
        if (local_528 < 4) {
LAB_0010a301:
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          goto LAB_0010a309;
        }
        uVar11 = (ushort)local_540[1] + 4;
        if (local_528 < uVar11) goto LAB_0010a301;
        if (*local_540 == 1) {
          if ((ushort)local_540[1] < 0x10) goto LAB_0010a301;
          local_510 = *(ulong *)(local_540 + 2);
          local_518 = *(ulong *)(local_540 + 6);
          bVar28 = true;
          goto LAB_00109ece;
        }
        local_540 = (short *)((long)local_540 + (ulong)uVar11);
        local_528 = local_528 - uVar11;
      } while (local_528 != 0);
    }
    bVar28 = false;
LAB_00109ece:
    if ((((local_header_u32[1]._2_1_ & 8) != 0) && (local_518 == 0)) &&
       (local_header_u32._14_4_ == 0)) {
      sVar13 = 0x18;
      if (!bVar28) {
        sVar13 = (ulong)(pmVar3->m_zip64 != 0) * 8 + 0x10;
      }
      sVar16 = (*pZip->m_pRead)(pZip->m_pIO_opaque,lVar1 + file_stat.m_comp_size,descriptor_buf,
                                sVar13);
      if (sVar16 == sVar13) {
        bVar27 = descriptor_buf._0_4_ != 0x8074b50;
        uVar24 = (uint)descriptor_buf._4_4_ >> 8 & 0xff;
        uVar11 = descriptor_buf._4_4_;
        if (!bVar27) {
          uVar11 = descriptor_buf._8_4_;
        }
        uVar10 = (uint)descriptor_buf._8_4_ >> 8 & 0xff;
        uVar25 = uVar24;
        if (!bVar27) {
          uVar25 = uVar10;
        }
        uVar19 = (uint)descriptor_buf._4_4_ >> 0x10 & 0xff;
        uVar22 = (uint)descriptor_buf[10];
        if (bVar27) {
          uVar22 = uVar19;
        }
        uVar4 = descriptor_buf._8_4_;
        uVar26 = (uint)descriptor_buf._4_4_ >> 0x18;
        if (!bVar27) {
          uVar4 = descriptor_buf._12_4_;
          uVar26 = (uint)descriptor_buf[0xb];
        }
        uVar18 = (uint)descriptor_buf[0xd];
        if (bVar27) {
          uVar18 = uVar10;
        }
        uVar10 = (uint)descriptor_buf._0_4_ >> 0x18;
        if (descriptor_buf._0_4_ == 0x8074b50) {
          uVar10 = (uint)descriptor_buf._4_4_ >> 0x18;
        }
        uVar5 = (uint)descriptor_buf._0_4_ >> 0x10;
        if (descriptor_buf._0_4_ == 0x8074b50) {
          uVar5 = uVar19;
        }
        uVar19 = (uint)descriptor_buf._0_4_ >> 8;
        uVar7 = descriptor_buf._0_4_;
        if (descriptor_buf._0_4_ == 0x8074b50) {
          uVar19 = uVar24;
          uVar7 = descriptor_buf._4_4_;
        }
        local_540 = (short *)(ulong)(uVar26 << 0x18 | uVar22 << 0x10 | uVar25 << 8 | uVar11 & 0xff);
        if ((bool)(~bVar28 & pmVar3->m_zip64 == 0)) {
          pbVar17 = descriptor_buf + 10;
          if (descriptor_buf._0_4_ == 0x8074b50) {
            pbVar17 = descriptor_buf + 0xe;
          }
          pbVar21 = descriptor_buf + 0xb;
          if (descriptor_buf._0_4_ == 0x8074b50) {
            pbVar21 = descriptor_buf + 0xf;
          }
          uVar23 = (ulong)((uint)*pbVar21 << 0x18 | (uint)*pbVar17 << 0x10 | uVar18 << 8) +
                   (ulong)(uVar4 & 0xff);
        }
        else {
          bVar28 = descriptor_buf._0_4_ == 0x8074b50;
          if (bVar28) {
            descriptor_buf[10] = descriptor_buf[0xe];
          }
          uVar23 = (ulong)descriptor_buf[0xb];
          uVar11 = (uint)descriptor_buf._12_4_ >> 0x18;
          uVar24 = descriptor_buf._12_4_;
          if (bVar28) {
            uVar23 = (ulong)uVar11;
            uVar24 = descriptor_buf._16_4_;
          }
          if (bVar28) {
            descriptor_buf[0xd] = descriptor_buf[0x11];
          }
          uVar22 = (uint)descriptor_buf._16_4_ >> 0x10 & 0xff;
          uVar25 = (uint)descriptor_buf[0xe];
          if (bVar28) {
            uVar25 = uVar22;
          }
          uVar6 = descriptor_buf._16_4_;
          if (bVar28) {
            uVar6 = descriptor_buf._20_4_;
            uVar11 = (uint)descriptor_buf._16_4_ >> 0x18;
          }
          bVar2 = descriptor_buf[0x15];
          if (!bVar28) {
            bVar2 = descriptor_buf[0x11];
          }
          uVar26 = (uint)descriptor_buf._20_4_ >> 0x10 & 0xff;
          if (!bVar28) {
            uVar26 = uVar22;
          }
          uVar15 = (ulong)descriptor_buf[0x17];
          if (!bVar28) {
            uVar15 = (ulong)((uint)descriptor_buf._16_4_ >> 0x18);
          }
          local_540 = (short *)((long)local_540 +
                               ((ulong)(uVar4 & 0xff) << 0x20 | (ulong)uVar18 << 0x28 |
                                (ulong)descriptor_buf[10] << 0x30 | uVar23 << 0x38));
          uVar23 = CONCAT44(uVar6,uVar11 << 0x18 |
                                  uVar25 << 0x10 | (uint)descriptor_buf[0xd] << 8 | uVar24 & 0xff) &
                   0xffffffffff | (ulong)bVar2 << 0x28 | (ulong)uVar26 << 0x30 | uVar15 << 0x38;
        }
        mVar12 = MZ_ZIP_VALIDATION_FAILED;
        if ((((uVar10 << 0x18 | (uVar5 & 0xff) << 0x10 | (uVar19 & 0xff) << 8 | uVar7 & 0xff) ==
              file_stat.m_crc32) && (local_540 == (short *)file_stat.m_comp_size)) &&
           (uVar23 == file_stat.m_uncomp_size)) goto LAB_0010a29a;
      }
      else {
        mVar12 = MZ_ZIP_FILE_READ_FAILED;
      }
      pZip->m_last_error = mVar12;
      goto LAB_0010a309;
    }
    if (((local_header_u32._14_4_ == file_stat.m_crc32) && (local_518 == file_stat.m_comp_size)) &&
       (local_510 == file_stat.m_uncomp_size)) {
LAB_0010a29a:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4d8.m_p);
      if ((flags >> 0xd & 1) != 0) {
        return 1;
      }
      mVar8 = mz_zip_reader_extract_to_callback
                        (pZip,file_index,mz_zip_compute_crc32_callback,&uncomp_crc32,0);
      if (mVar8 == 0) {
        return 0;
      }
      if (uncomp_crc32 == file_stat.m_crc32) {
        return 1;
      }
      pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
      return 0;
    }
  }
  else {
    sVar13 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat.m_local_header_ofs + 0x1e,local_4d8.m_p,
                              uVar23);
    if (sVar13 != uVar23) {
LAB_0010a215:
      pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      goto LAB_0010a309;
    }
    iVar9 = bcmp(file_stat.m_filename,__s2,uVar23);
    if (iVar9 == 0) goto LAB_00109ea9;
  }
  pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
LAB_0010a309:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4d8.m_p);
  return 0;
}

Assistant:

mz_bool mz_zip_validate_file(mz_zip_archive *pZip, mz_uint file_index,
                             mz_uint flags) {
  mz_zip_archive_file_stat file_stat;
  mz_zip_internal_state *pState;
  const mz_uint8 *pCentral_dir_header;
  mz_bool found_zip64_ext_data_in_cdir = MZ_FALSE;
  mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  mz_uint64 local_header_ofs = 0;
  mz_uint32 local_header_filename_len, local_header_extra_len,
      local_header_crc32;
  mz_uint64 local_header_comp_size, local_header_uncomp_size;
  mz_uint32 uncomp_crc32 = MZ_CRC32_INIT;
  mz_bool has_data_descriptor;
  mz_uint32 local_header_bit_flags;

  mz_zip_array file_data_array;
  mz_zip_array_init(&file_data_array, 1);

  if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) ||
      (!pZip->m_pRead))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (file_index > pZip->m_total_files)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  pState = pZip->m_pState;

  pCentral_dir_header = mz_zip_get_cdh(pZip, file_index);

  if (!mz_zip_file_stat_internal(pZip, file_index, pCentral_dir_header,
                                 &file_stat, &found_zip64_ext_data_in_cdir))
    return MZ_FALSE;

  /* A directory or zero length file */
  if ((file_stat.m_is_directory) || (!file_stat.m_uncomp_size))
    return MZ_TRUE;

  /* Encryption and patch files are not supported. */
  if (file_stat.m_is_encrypted)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

  /* This function only supports stored and deflate. */
  if ((file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

  if (!file_stat.m_is_supported)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

  /* Read and parse the local directory entry. */
  local_header_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  local_header_filename_len =
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
  local_header_extra_len =
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  local_header_comp_size =
      MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
  local_header_uncomp_size =
      MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
  local_header_crc32 = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_CRC32_OFS);
  local_header_bit_flags =
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
  has_data_descriptor = (local_header_bit_flags & 8) != 0;

  if (local_header_filename_len != strlen(file_stat.m_filename))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if ((local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
       local_header_filename_len + local_header_extra_len +
       file_stat.m_comp_size) > pZip->m_archive_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if (!mz_zip_array_resize(
          pZip, &file_data_array,
          MZ_MAX(local_header_filename_len, local_header_extra_len),
          MZ_FALSE)) {
    mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    goto handle_failure;
  }

  if (local_header_filename_len) {
    if (pZip->m_pRead(pZip->m_pIO_opaque,
                      local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE,
                      file_data_array.m_p,
                      local_header_filename_len) != local_header_filename_len) {
      mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
      goto handle_failure;
    }

    /* I've seen 1 archive that had the same pathname, but used backslashes in
     * the local dir and forward slashes in the central dir. Do we care about
     * this? For now, this case will fail validation. */
    if (memcmp(file_stat.m_filename, file_data_array.m_p,
               local_header_filename_len) != 0) {
      mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
      goto handle_failure;
    }
  }

  if ((local_header_extra_len) &&
      ((local_header_comp_size == MZ_UINT32_MAX) ||
       (local_header_uncomp_size == MZ_UINT32_MAX))) {
    mz_uint32 extra_size_remaining = local_header_extra_len;
    const mz_uint8 *pExtra_data = (const mz_uint8 *)file_data_array.m_p;

    if (pZip->m_pRead(pZip->m_pIO_opaque,
                      local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
                          local_header_filename_len,
                      file_data_array.m_p,
                      local_header_extra_len) != local_header_extra_len) {
      mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
      goto handle_failure;
    }

    do {
      mz_uint32 field_id, field_data_size, field_total_size;

      if (extra_size_remaining < (sizeof(mz_uint16) * 2)) {
        mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
        goto handle_failure;
      }

      field_id = MZ_READ_LE16(pExtra_data);
      field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
      field_total_size = field_data_size + sizeof(mz_uint16) * 2;

      if (field_total_size > extra_size_remaining) {
        mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
        goto handle_failure;
      }

      if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
        const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

        if (field_data_size < sizeof(mz_uint64) * 2) {
          mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
          goto handle_failure;
        }

        local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
        local_header_comp_size =
            MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64));

        found_zip64_ext_data_in_ldir = MZ_TRUE;
        break;
      }

      pExtra_data += field_total_size;
      extra_size_remaining -= field_total_size;
    } while (extra_size_remaining);
  }

  /* TODO: parse local header extra data when local_header_comp_size is
   * 0xFFFFFFFF! (big_descriptor.zip) */
  /* I've seen zips in the wild with the data descriptor bit set, but proper
   * local header values and bogus data descriptors */
  if ((has_data_descriptor) && (!local_header_comp_size) &&
      (!local_header_crc32)) {
    mz_uint8 descriptor_buf[32];
    mz_bool has_id;
    const mz_uint8 *pSrc;
    mz_uint32 file_crc32;
    mz_uint64 comp_size = 0, uncomp_size = 0;

    mz_uint32 num_descriptor_uint32s =
        ((pState->m_zip64) || (found_zip64_ext_data_in_ldir)) ? 6 : 4;

    if (pZip->m_pRead(pZip->m_pIO_opaque,
                      local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
                          local_header_filename_len + local_header_extra_len +
                          file_stat.m_comp_size,
                      descriptor_buf,
                      sizeof(mz_uint32) * num_descriptor_uint32s) !=
        (sizeof(mz_uint32) * num_descriptor_uint32s)) {
      mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
      goto handle_failure;
    }

    has_id = (MZ_READ_LE32(descriptor_buf) == MZ_ZIP_DATA_DESCRIPTOR_ID);
    pSrc = has_id ? (descriptor_buf + sizeof(mz_uint32)) : descriptor_buf;

    file_crc32 = MZ_READ_LE32(pSrc);

    if ((pState->m_zip64) || (found_zip64_ext_data_in_ldir)) {
      comp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32));
      uncomp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32) + sizeof(mz_uint64));
    } else {
      comp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32));
      uncomp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32) + sizeof(mz_uint32));
    }

    if ((file_crc32 != file_stat.m_crc32) ||
        (comp_size != file_stat.m_comp_size) ||
        (uncomp_size != file_stat.m_uncomp_size)) {
      mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
      goto handle_failure;
    }
  } else {
    if ((local_header_crc32 != file_stat.m_crc32) ||
        (local_header_comp_size != file_stat.m_comp_size) ||
        (local_header_uncomp_size != file_stat.m_uncomp_size)) {
      mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
      goto handle_failure;
    }
  }

  mz_zip_array_clear(pZip, &file_data_array);

  if ((flags & MZ_ZIP_FLAG_VALIDATE_HEADERS_ONLY) == 0) {
    if (!mz_zip_reader_extract_to_callback(
            pZip, file_index, mz_zip_compute_crc32_callback, &uncomp_crc32, 0))
      return MZ_FALSE;

    /* 1 more check to be sure, although the extract checks too. */
    if (uncomp_crc32 != file_stat.m_crc32) {
      mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
      return MZ_FALSE;
    }
  }

  return MZ_TRUE;

handle_failure:
  mz_zip_array_clear(pZip, &file_data_array);
  return MZ_FALSE;
}